

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

BSDFSample * __thiscall
pbrt::HairBxDF::Sample_f
          (HairBxDF *this,Vector3f wo,Float uc,Point2f *u,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  Float FVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  span<const_float> weights;
  Vector3f wi_00;
  Vector3f wo_00;
  int p_00;
  BxDFFlags flags;
  float *pfVar5;
  Tuple2<pbrt::Point2,_float> *in_RDX;
  HairBxDF *in_RSI;
  BSDFSample *in_RDI;
  Vector3f *pVVar6;
  float in_R8D;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Float FVar12;
  Float FVar13;
  double dVar14;
  undefined1 auVar16 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar22 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  double dVar15;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  uint in_XMM1_Da;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  float in_XMM2_Da;
  array<float,_4> aVar26;
  SampledSpectrum SVar27;
  Float cosThetap_o_1;
  Float sinThetap_o_1;
  int p_1;
  Float pdf;
  Vector3f wi;
  Float phi_i;
  Float dphi;
  Float gamma_t;
  Float cosGamma_t;
  Float sinGamma_t;
  Float etap;
  Float cosTheta_i;
  Float sinTheta_i;
  Float cosPhi;
  Float sinTheta;
  Float cosTheta;
  Float cosThetap_o;
  Float sinThetap_o;
  int p;
  array<float,_4> apPDF;
  Float phi_o;
  Float cosTheta_o;
  Float sinTheta_o;
  float in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  float gamma_t_00;
  Float in_stack_fffffffffffffea8;
  Float in_stack_fffffffffffffeac;
  float s;
  Float in_stack_fffffffffffffeb0;
  Float in_stack_fffffffffffffeb4;
  Float in_stack_fffffffffffffeb8;
  float sinTheta_i_00;
  Float *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  size_t in_stack_ffffffffffffff18;
  SampledSpectrum local_d8;
  float local_c8;
  float local_c4;
  uint local_c0;
  Float local_bc;
  Vector3f local_b8;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  Float in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  TransportMode in_stack_ffffffffffffff9c;
  float fVar28;
  float v;
  HairBxDF *pHVar29;
  float fVar30;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar25 [56];
  
  FVar13 = (Float)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  uVar2 = vmovlpd_avx(in_ZMM0._0_16_);
  v = (float)uVar2;
  pHVar29 = in_RSI;
  fVar30 = v;
  Sqr<float>(v);
  fVar7 = SafeSqrt(0.0);
  auVar25 = (undefined1  [56])0x0;
  dVar14 = std::atan2((double)(ulong)in_XMM1_Da,(double)(uVar2 >> 0x20));
  auVar22 = (undefined1  [56])0x0;
  aVar26 = ComputeApPDF((HairBxDF *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c);
  auVar23._0_8_ = aVar26.values._8_8_;
  auVar23._8_56_ = auVar25;
  auVar17._0_8_ = aVar26.values._0_8_;
  auVar17._8_56_ = auVar22;
  uVar3 = vmovlpd_avx(auVar17._0_16_);
  fVar28 = (float)uVar3;
  vmovlpd_avx(auVar23._0_16_);
  pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
            ((span<const_float> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (array<float,_4> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  weights.ptr._4_4_ = in_stack_ffffffffffffff14;
  weights.ptr._0_4_ = in_stack_ffffffffffffff10;
  weights.n = in_stack_ffffffffffffff18;
  p_00 = SampleDiscrete(weights,FVar13,
                        (Float *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffef8);
  if (p_00 == 0) {
    auVar16 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[1]),ZEXT416((uint)v),
                              ZEXT416((uint)-(fVar7 * in_RSI->sin2kAlpha[1])));
    auVar4 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[1]),ZEXT416((uint)fVar7),
                             ZEXT416((uint)(v * in_RSI->sin2kAlpha[1])));
    local_78 = auVar4._0_4_;
    local_74 = auVar16._0_4_;
  }
  else if (p_00 == 1) {
    auVar16 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[0]),ZEXT416((uint)v),
                              ZEXT416((uint)(fVar7 * in_RSI->sin2kAlpha[0])));
    auVar4 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[0]),ZEXT416((uint)fVar7),
                             ZEXT416((uint)-(v * in_RSI->sin2kAlpha[0])));
    local_78 = auVar4._0_4_;
    local_74 = auVar16._0_4_;
  }
  else {
    local_78 = fVar7;
    local_74 = v;
    if (p_00 == 2) {
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[2]),ZEXT416((uint)v),
                                ZEXT416((uint)(fVar7 * in_RSI->sin2kAlpha[2])));
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[2]),ZEXT416((uint)fVar7),
                               ZEXT416((uint)-(v * in_RSI->sin2kAlpha[2])));
      local_78 = auVar4._0_4_;
      local_74 = auVar16._0_4_;
    }
  }
  FVar13 = in_RSI->v[p_00];
  local_80 = Tuple2<pbrt::Point2,_float>::operator[](in_RDX,0);
  local_84 = 1e-05;
  pfVar5 = std::max<float>(&local_80,&local_84);
  sinTheta_i_00 = *pfVar5;
  fVar8 = Tuple2<pbrt::Point2,_float>::operator[](in_RDX,0);
  fVar8 = 1.0 - fVar8;
  auVar16._0_4_ = -2.0 / in_RSI->v[p_00];
  auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar18._0_8_ = std::exp(auVar16._0_8_);
  auVar18._8_56_ = extraout_var_00;
  auVar16 = vfmadd213ss_fma(auVar18._0_16_,ZEXT416((uint)fVar8),ZEXT416((uint)sinTheta_i_00));
  auVar19._0_8_ = std::log(auVar16._0_8_);
  auVar19._8_56_ = extraout_var_01;
  auVar16 = vfmadd213ss_fma(auVar19._0_16_,ZEXT416((uint)FVar13),SUB6416(ZEXT464(0x3f800000),0));
  local_7c = auVar16._0_4_;
  Sqr<float>(local_7c);
  fVar9 = SafeSqrt(0.0);
  fVar10 = Tuple2<pbrt::Point2,_float>::operator[](in_RDX,1);
  dVar15 = std::cos((double)(ulong)(uint)(fVar10 * 6.2831855));
  auVar16 = vfmadd213ss_fma(ZEXT416((uint)local_74),ZEXT416((uint)-local_7c),
                            ZEXT416((uint)(fVar9 * SUB84(dVar15,0) * local_78)));
  fVar9 = auVar16._0_4_;
  Sqr<float>(fVar9);
  fVar10 = SafeSqrt(0.0);
  FVar12 = in_RSI->eta;
  FVar1 = in_RSI->eta;
  fVar11 = Sqr<float>(v);
  vfmadd213ss_fma(ZEXT416((uint)FVar1),ZEXT416((uint)FVar12),ZEXT416((uint)-fVar11));
  local_98 = SafeSqrt(0.0);
  local_98 = local_98 / fVar7;
  local_9c = in_RSI->h / local_98;
  Sqr<float>(local_9c);
  local_a0 = SafeSqrt(0.0);
  local_a4 = SafeASin(0.0);
  if (p_00 < 3) {
    in_stack_fffffffffffffeb8 = Phi(p_00,in_RSI->gamma_o,local_a4);
    FVar12 = SampleTrimmedLogistic
                       (in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
    local_a8 = in_stack_fffffffffffffeb8 + FVar12;
  }
  else {
    local_a8 = in_XMM2_Da * 6.2831855;
  }
  local_ac = SUB84(dVar14,0) + local_a8;
  s = fVar10;
  dVar14 = std::cos((double)(ulong)(uint)local_ac);
  fVar11 = fVar10 * SUB84(dVar14,0);
  std::sin((double)(ulong)(uint)local_ac);
  pVVar6 = &local_b8;
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,0.0);
  local_bc = 0.0;
  for (local_c0 = 0; (int)local_c0 < 3; local_c0 = local_c0 + 1) {
    if (local_c0 == 0) {
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[1]),ZEXT416((uint)v),
                                ZEXT416((uint)-(fVar7 * in_RSI->sin2kAlpha[1])));
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[1]),ZEXT416((uint)fVar7),
                               ZEXT416((uint)(v * in_RSI->sin2kAlpha[1])));
      local_c8 = auVar4._0_4_;
      local_c4 = auVar16._0_4_;
    }
    else if (local_c0 == 1) {
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[0]),ZEXT416((uint)v),
                                ZEXT416((uint)(fVar7 * in_RSI->sin2kAlpha[0])));
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[0]),ZEXT416((uint)fVar7),
                               ZEXT416((uint)-(v * in_RSI->sin2kAlpha[0])));
      local_c8 = auVar4._0_4_;
      local_c4 = auVar16._0_4_;
    }
    else {
      local_c8 = fVar7;
      local_c4 = v;
      if (local_c0 == 2) {
        auVar16 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[2]),ZEXT416((uint)v),
                                  ZEXT416((uint)(fVar7 * in_RSI->sin2kAlpha[2])));
        auVar4 = vfmadd213ss_fma(ZEXT416((uint)in_RSI->cos2kAlpha[2]),ZEXT416((uint)fVar7),
                                 ZEXT416((uint)-(v * in_RSI->sin2kAlpha[2])));
        local_c8 = auVar4._0_4_;
        local_c4 = auVar16._0_4_;
      }
    }
    std::abs((int)pVVar6);
    FVar12 = Mp(FVar13,fVar8,sinTheta_i_00,in_stack_fffffffffffffeb8,fVar9);
    pfVar5 = pstd::array<float,_4>::operator[]
                       ((array<float,_4> *)&stack0xffffffffffffffa4,(long)(int)local_c0);
    gamma_t_00 = FVar12 * *pfVar5;
    pVVar6 = (Vector3f *)(ulong)local_c0;
    auVar20._0_4_ = Np(fVar9,(int)fVar11,s,fVar10,gamma_t_00);
    auVar20._4_60_ = extraout_var;
    auVar16 = vfmadd213ss_fma(auVar20._0_16_,ZEXT416((uint)gamma_t_00),ZEXT416((uint)local_bc));
    local_bc = auVar16._0_4_;
  }
  FVar13 = Mp(FVar13,fVar8,sinTheta_i_00,in_stack_fffffffffffffeb8,fVar9);
  pfVar5 = pstd::array<float,_4>::operator[]((array<float,_4> *)&stack0xffffffffffffffa4,3);
  auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3e22f983),0),ZEXT416((uint)(FVar13 * *pfVar5)),
                            ZEXT416((uint)local_bc));
  local_bc = auVar16._0_4_;
  auVar22 = ZEXT856(0);
  auVar25 = (undefined1  [56])0x0;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar30;
  wo_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = pHVar29;
  wi_00.super_Tuple3<pbrt::Vector3,_float>.y = v;
  wi_00.super_Tuple3<pbrt::Vector3,_float>.x = fVar7;
  wi_00.super_Tuple3<pbrt::Vector3,_float>.z = in_R8D;
  SVar27 = f((HairBxDF *)CONCAT44(fVar28,p_00),wo_00,wi_00,in_stack_ffffffffffffff9c);
  auVar24._0_8_ = SVar27.values.values._8_8_;
  auVar24._8_56_ = auVar25;
  auVar21._0_8_ = SVar27.values.values._0_8_;
  auVar21._8_56_ = auVar22;
  local_d8.values.values._0_8_ = vmovlpd_avx(auVar21._0_16_);
  local_d8.values.values._8_8_ = vmovlpd_avx(auVar24._0_16_);
  FVar13 = local_bc;
  flags = Flags(in_RSI);
  BSDFSample::BSDFSample(in_RDI,&local_d8,&local_b8,FVar13,flags);
  return in_RDI;
}

Assistant:

BSDFSample HairBxDF::Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                              BxDFReflTransFlags sampleFlags) const {
    // Compute hair coordinate system terms related to _wo_
    Float sinTheta_o = wo.x;
    Float cosTheta_o = SafeSqrt(1 - Sqr(sinTheta_o));
    Float phi_o = std::atan2(wo.z, wo.y);

    // Determine which term $p$ to sample for hair scattering
    pstd::array<Float, pMax + 1> apPDF = ComputeApPDF(cosTheta_o);
    int p = SampleDiscrete(apPDF, uc, nullptr, &uc);

    // Rotate $\sin \thetao$ and $\cos \thetao$ to account for hair scale tilt
    Float sinThetap_o, cosThetap_o;
    if (p == 0) {
        sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
        cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
    } else if (p == 1) {
        sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
        cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
    } else if (p == 2) {
        sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
        cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
    } else {
        sinThetap_o = sinTheta_o;
        cosThetap_o = cosTheta_o;
    }

    // Sample $M_p$ to compute $\thetai$
    Float cosTheta = 1 + v[p] * std::log(std::max<Float>(u[0], 1e-5) +
                                         (1 - u[0]) * std::exp(-2 / v[p]));
    Float sinTheta = SafeSqrt(1 - Sqr(cosTheta));
    Float cosPhi = std::cos(2 * Pi * u[1]);
    Float sinTheta_i = -cosTheta * sinThetap_o + sinTheta * cosPhi * cosThetap_o;
    Float cosTheta_i = SafeSqrt(1 - Sqr(sinTheta_i));

    // Sample $N_p$ to compute $\Delta\phi$
    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float cosGamma_t = SafeSqrt(1 - Sqr(sinGamma_t));
    Float gamma_t = SafeASin(sinGamma_t);

    Float dphi;
    if (p < pMax)
        dphi = Phi(p, gamma_o, gamma_t) + SampleTrimmedLogistic(uc, s, -Pi, Pi);
    else
        dphi = 2 * Pi * uc;

    // Compute _wi_ from sampled hair scattering angles
    Float phi_i = phi_o + dphi;
    Vector3f wi(sinTheta_i, cosTheta_i * std::cos(phi_i), cosTheta_i * std::sin(phi_i));

    // Compute PDF for sampled hair scattering direction _wi_
    Float pdf = 0;
    for (int p = 0; p < pMax; ++p) {
        // Rotate $\sin \thetao$ and $\cos \thetao$ to account for hair scale tilt
        Float sinThetap_o, cosThetap_o;
        if (p == 0) {
            sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
            cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
        } else if (p == 1) {
            sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
            cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
        } else if (p == 2) {
            sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
            cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
        } else {
            sinThetap_o = sinTheta_o;
            cosThetap_o = cosTheta_o;
        }

        // Handle out-of-range $\cos \thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);

        pdf += Mp(cosTheta_i, cosThetap_o, sinTheta_i, sinThetap_o, v[p]) * apPDF[p] *
               Np(dphi, p, s, gamma_o, gamma_t);
    }
    pdf += Mp(cosTheta_i, cosTheta_o, sinTheta_i, sinTheta_o, v[pMax]) * apPDF[pMax] *
           (1 / (2 * Pi));
    // if (std::abs(wi->x) < .9999) CHECK_NEAR(*pdf, PDF(wo, *wi), .01);

    return BSDFSample(f(wo, wi, mode), wi, pdf, Flags());
}